

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcShow.c
# Opt level: O0

void Wlc_NtkDumpDot(Wlc_Ntk_t *p,char *pFileName,Vec_Int_t *vBold)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  FILE *__stream;
  Wlc_Obj_t *pWVar7;
  char *pcVar8;
  word *pwVar9;
  char *pcVar10;
  Wlc_Obj_t *pWVar11;
  char *local_70;
  int local_44;
  int iFanin;
  int k;
  int i;
  int Level;
  int Prev;
  int LevelMax;
  Wlc_Obj_t *pNode;
  FILE *pFile;
  Vec_Int_t *vBold_local;
  char *pFileName_local;
  Wlc_Ntk_t *p_local;
  
  if (vBold == (Vec_Int_t *)0x0) {
    iVar2 = Wlc_NtkObjNum(p);
  }
  else {
    iVar2 = Vec_IntSize(vBold);
  }
  if (iVar2 < 0x7d1) {
    __stream = fopen(pFileName,"w");
    if (__stream == (FILE *)0x0) {
      fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",pFileName);
    }
    else {
      if (vBold != (Vec_Int_t *)0x0) {
        for (iFanin = 0; iVar2 = Vec_IntSize(vBold), iFanin < iVar2; iFanin = iFanin + 1) {
          iVar2 = Vec_IntEntry(vBold,iFanin);
          pWVar7 = Wlc_NtkObj(p,iVar2);
          *(ushort *)pWVar7 = *(ushort *)pWVar7 & 0xff7f | 0x80;
        }
      }
      iVar2 = Wlc_NtkCreateLevels(p);
      Level = iVar2 + 1;
      if (vBold != (Vec_Int_t *)0x0) {
        Level = Wlc_NtkRemapLevels(p,vBold,Level);
      }
      fprintf(__stream,"# %s\n","WLC structure generated by ABC");
      fprintf(__stream,"\n");
      fprintf(__stream,"digraph WLC {\n");
      fprintf(__stream,"size = \"7.5,10\";\n");
      fprintf(__stream,"center = true;\n");
      fprintf(__stream,"edge [dir = back];\n");
      fprintf(__stream,"\n");
      fprintf(__stream,"{\n");
      fprintf(__stream,"  node [shape = plaintext];\n");
      fprintf(__stream,"  edge [style = invis];\n");
      fprintf(__stream,"  LevelTitle1 [label=\"\"];\n");
      fprintf(__stream,"  LevelTitle2 [label=\"\"];\n");
      for (k = Level; -1 < k; k = k + -1) {
        fprintf(__stream,"  Level%d",(ulong)(uint)k);
        fprintf(__stream," [label = ");
        fprintf(__stream,"\"");
        fprintf(__stream,"\"");
        fprintf(__stream,"];\n");
      }
      fprintf(__stream,"  LevelTitle1 ->  LevelTitle2 ->");
      for (k = Level; -1 < k; k = k + -1) {
        fprintf(__stream,"  Level%d",(ulong)(uint)k);
        if (k == 0) {
          fprintf(__stream,";");
        }
        else {
          fprintf(__stream," ->");
        }
      }
      fprintf(__stream,"\n");
      fprintf(__stream,"}");
      fprintf(__stream,"\n");
      fprintf(__stream,"\n");
      fprintf(__stream,"{\n");
      fprintf(__stream,"  rank = same;\n");
      fprintf(__stream,"  LevelTitle1;\n");
      fprintf(__stream,"  title1 [shape=plaintext,\n");
      fprintf(__stream,"          fontsize=20,\n");
      fprintf(__stream,"          fontname = \"Times-Roman\",\n");
      fprintf(__stream,"          label=\"");
      fprintf(__stream,"%s","WLC structure generated by ABC");
      fprintf(__stream,"\\n");
      pcVar10 = p->pName;
      if (p->pSpec == (char *)0x0) {
        local_70 = "unknown";
      }
      else {
        local_70 = Extra_FileNameWithoutPath(p->pSpec);
      }
      fprintf(__stream,"Benchmark \\\"%s\\\" from file \\\"%s\\\". ",pcVar10,local_70);
      fprintf(__stream,"\"\n");
      fprintf(__stream,"         ];\n");
      fprintf(__stream,"}");
      fprintf(__stream,"\n");
      fprintf(__stream,"\n");
      fprintf(__stream,"{\n");
      fprintf(__stream,"  rank = same;\n");
      fprintf(__stream,"  LevelTitle2;\n");
      fprintf(__stream,"  title2 [shape=plaintext,\n");
      fprintf(__stream,"          fontsize=18,\n");
      fprintf(__stream,"          fontname = \"Times-Roman\",\n");
      fprintf(__stream,"          label=\"");
      iVar2 = Wlc_NtkObjNum(p);
      iVar3 = Wlc_NtkCiNum(p);
      fprintf(__stream,"The word-level network contains %d nodes and spans %d levels.",
              (ulong)(uint)(iVar2 - iVar3),(ulong)(Level - 1));
      fprintf(__stream,"\\n");
      fprintf(__stream,"\"\n");
      fprintf(__stream,"         ];\n");
      fprintf(__stream,"}");
      fprintf(__stream,"\n");
      fprintf(__stream,"\n");
      fprintf(__stream,"{\n");
      fprintf(__stream,"  rank = same;\n");
      fprintf(__stream,"  Level%d;\n",(ulong)(uint)Level);
      for (iFanin = 0; iVar2 = Wlc_NtkCoNum(p), iFanin < iVar2; iFanin = iFanin + 1) {
        pWVar7 = Wlc_NtkCo(p,iFanin);
        if ((vBold == (Vec_Int_t *)0x0) || ((*(ushort *)pWVar7 >> 7 & 1) != 0)) {
          pWVar7 = Wlc_ObjCo2PoFo(p,iFanin);
          uVar4 = Wlc_ObjId(p,pWVar7);
          iVar2 = Wlc_ObjId(p,pWVar7);
          pcVar10 = Wlc_ObjName(p,iVar2);
          iVar2 = Wlc_ObjIsPo(pWVar7);
          pcVar8 = "_in";
          if (iVar2 != 0) {
            pcVar8 = "";
          }
          uVar5 = Wlc_ObjRange(pWVar7);
          fprintf(__stream,"  NodePo%d [label = \"%s%s %d\"",(ulong)uVar4,pcVar10,pcVar8,
                  (ulong)uVar5);
          iVar2 = Wlc_NtkPoNum(p);
          pcVar10 = "box";
          if (iFanin < iVar2) {
            pcVar10 = "invtriangle";
          }
          fprintf(__stream,", shape = %s",pcVar10);
          fprintf(__stream,", color = coral, fillcolor = coral");
          fprintf(__stream,"];\n");
        }
      }
      fprintf(__stream,"}");
      fprintf(__stream,"\n");
      fprintf(__stream,"\n");
      while (k = Level + -1, 0 < k) {
        fprintf(__stream,"{\n");
        fprintf(__stream,"  rank = same;\n");
        fprintf(__stream,"  Level%d;\n",(ulong)(uint)k);
        for (iFanin = 1; iVar2 = Wlc_NtkObjNumMax(p), iFanin < iVar2; iFanin = iFanin + 1) {
          pWVar7 = Wlc_NtkObj(p,iFanin);
          iVar2 = Wlc_ObjLevel(p,pWVar7);
          if ((iVar2 == k) && ((vBold == (Vec_Int_t *)0x0 || ((*(ushort *)pWVar7 >> 7 & 1) != 0))))
          {
            if ((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x3f) ==
                (undefined1  [24])0x6) {
              uVar4 = Wlc_ObjRange(pWVar7);
              fprintf(__stream,"  Node%d [label = \"%d:%d\'h",(ulong)(uint)iFanin,
                      (ulong)(uint)iFanin,(ulong)uVar4);
              iVar2 = Wlc_ObjRange(pWVar7);
              if (iVar2 < 0x41) {
                pwVar9 = (word *)Wlc_ObjConstValue(pWVar7);
                iVar2 = Wlc_ObjRange(pWVar7);
                Abc_TtPrintHexArrayRev((FILE *)__stream,pwVar9,(iVar2 + 3) / 4);
              }
              else {
                pwVar9 = (word *)Wlc_ObjConstValue(pWVar7);
                Abc_TtPrintHexArrayRev((FILE *)__stream,pwVar9,0x10);
                fprintf(__stream,"...");
              }
              fprintf(__stream,"\"");
            }
            else if (((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x3f) ==
                      (undefined1  [24])0x7) ||
                    ((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x3f) ==
                     (undefined1  [24])0x8)) {
              uVar4 = Wlc_ObjRange(pWVar7);
              fprintf(__stream,"  Node%d [label = \"%d: %d\"",(ulong)(uint)iFanin,
                      (ulong)(uint)iFanin,(ulong)uVar4);
            }
            else if (((*(ushort *)pWVar7 & 0x3f) < 0x1a) || (0x24 < (*(ushort *)pWVar7 & 0x3f))) {
              pcVar10 = Wlc_ObjTypeName(pWVar7);
              uVar4 = Wlc_ObjRange(pWVar7);
              fprintf(__stream,"  Node%d [label = \"%d:%s %d\"",(ulong)(uint)iFanin,
                      (ulong)(uint)iFanin,pcVar10,(ulong)uVar4);
            }
            else {
              pcVar10 = Wlc_ObjTypeName(pWVar7);
              fprintf(__stream,"  Node%d [label = \"%d:%s\"",(ulong)(uint)iFanin,(ulong)(uint)iFanin
                      ,pcVar10);
            }
            if ((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x3f) ==
                (undefined1  [24])0x2d) {
              fprintf(__stream,", shape = doublecircle");
            }
            else if (((*(ushort *)pWVar7 & 0x3f) < 0x1f) || (0x24 < (*(ushort *)pWVar7 & 0x3f))) {
              if (((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x3f) ==
                   (undefined1  [24])0x16) ||
                 (((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x3f) ==
                   (undefined1  [24])0x17 ||
                  ((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x3f) ==
                   (undefined1  [24])0x5)))) {
                fprintf(__stream,", shape = box");
              }
              else if ((((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x3f) ==
                         (undefined1  [24])0x7) ||
                       ((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x3f) ==
                        (undefined1  [24])0x18)) ||
                      ((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x3f) ==
                       (undefined1  [24])0x19)) {
                fprintf(__stream,", shape = triangle");
              }
              else if ((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x3f) ==
                       (undefined1  [24])0x8) {
                fprintf(__stream,", shape = trapezium");
              }
              else {
                fprintf(__stream,", shape = ellipse");
              }
            }
            else {
              fprintf(__stream,", shape = diamond");
            }
            if (vBold == (Vec_Int_t *)0x0) {
              if (((0x2a < (*(ushort *)pWVar7 & 0x3f)) && ((*(ushort *)pWVar7 & 0x3f) < 0x35)) ||
                 ((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x3f) ==
                  (undefined1  [24])0xf)) goto LAB_00413081;
            }
            else if ((*(ushort *)pWVar7 >> 7 & 1) != 0) {
LAB_00413081:
              fprintf(__stream,", style = filled");
            }
            fprintf(__stream,"];\n");
          }
        }
        fprintf(__stream,"}");
        fprintf(__stream,"\n");
        fprintf(__stream,"\n");
        Level = k;
      }
      fprintf(__stream,"{\n");
      fprintf(__stream,"  rank = same;\n");
      fprintf(__stream,"  Level%d;\n",0);
      for (iFanin = 1; iVar2 = Wlc_NtkObjNumMax(p), iFanin < iVar2; iFanin = iFanin + 1) {
        pWVar7 = Wlc_NtkObj(p,iFanin);
        iVar2 = Wlc_ObjIsCi(pWVar7);
        if (((iVar2 != 0) || (iVar2 = Wlc_ObjFaninNum(pWVar7), iVar2 < 1)) &&
           ((vBold == (Vec_Int_t *)0x0 || ((*(ushort *)pWVar7 >> 7 & 1) != 0)))) {
          if ((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x3f) ==
              (undefined1  [24])0x6) {
            uVar4 = Wlc_ObjRange(pWVar7);
            fprintf(__stream,"  Node%d [label = \"%d:%d\'h",(ulong)(uint)iFanin,(ulong)(uint)iFanin,
                    (ulong)uVar4);
            iVar2 = Wlc_ObjRange(pWVar7);
            if (iVar2 < 0x41) {
              pwVar9 = (word *)Wlc_ObjConstValue(pWVar7);
              iVar2 = Wlc_ObjRange(pWVar7);
              Abc_TtPrintHexArrayRev((FILE *)__stream,pwVar9,(iVar2 + 3) / 4);
            }
            else {
              pwVar9 = (word *)Wlc_ObjConstValue(pWVar7);
              Abc_TtPrintHexArrayRev((FILE *)__stream,pwVar9,0x10);
              fprintf(__stream,"...");
            }
            fprintf(__stream,"\"");
          }
          else {
            uVar4 = Wlc_ObjId(p,pWVar7);
            uVar5 = Wlc_ObjId(p,pWVar7);
            iVar2 = Wlc_ObjId(p,pWVar7);
            pcVar10 = Wlc_ObjName(p,iVar2);
            uVar6 = Wlc_ObjRange(pWVar7);
            fprintf(__stream,"  Node%d [label = \"%d:%s %d\"",(ulong)uVar4,(ulong)uVar5,pcVar10,
                    (ulong)uVar6);
            iVar2 = Vec_IntSize(&p->vFfs2);
            bVar1 = true;
            if (iVar2 < 1) {
              iVar2 = Wlc_ObjCiId(pWVar7);
              iVar3 = Wlc_NtkPiNum(p);
              bVar1 = iVar2 < iVar3;
            }
            pcVar10 = ", shape = box";
            if (bVar1) {
              pcVar10 = ", shape = triangle";
            }
            fprintf(__stream,", shape = %s",pcVar10 + 10);
            fprintf(__stream,", color = coral, fillcolor = coral");
          }
          fprintf(__stream,"];\n");
        }
      }
      fprintf(__stream,"}");
      fprintf(__stream,"\n");
      fprintf(__stream,"\n");
      fprintf(__stream,"title1 -> title2 [style = invis];\n");
      for (iFanin = 0; iVar2 = Wlc_NtkCoNum(p), iFanin < iVar2; iFanin = iFanin + 1) {
        pWVar7 = Wlc_NtkCo(p,iFanin);
        if ((vBold == (Vec_Int_t *)0x0) || ((*(ushort *)pWVar7 >> 7 & 1) != 0)) {
          pWVar7 = Wlc_ObjCo2PoFo(p,iFanin);
          uVar4 = Wlc_ObjId(p,pWVar7);
          fprintf(__stream,"title2 -> NodePo%d [style = invis];\n",(ulong)uVar4);
        }
      }
      i = -1;
      for (iFanin = 0; iVar2 = Wlc_NtkCoNum(p), iFanin < iVar2; iFanin = iFanin + 1) {
        Wlc_NtkCo(p,iFanin);
        pWVar7 = Wlc_ObjCo2PoFo(p,iFanin);
        if ((vBold == (Vec_Int_t *)0x0) || ((*(ushort *)pWVar7 >> 7 & 1) != 0)) {
          if (-1 < i) {
            uVar4 = Wlc_ObjId(p,pWVar7);
            fprintf(__stream,"NodePo%d -> NodePo%d [style = invis];\n",(ulong)(uint)i,(ulong)uVar4);
          }
          i = Wlc_ObjId(p,pWVar7);
        }
      }
      i = -1;
      for (iFanin = 0; iVar2 = Wlc_NtkCiNum(p), iFanin < iVar2; iFanin = iFanin + 1) {
        pWVar7 = Wlc_NtkCi(p,iFanin);
        if ((vBold == (Vec_Int_t *)0x0) || ((*(ushort *)pWVar7 >> 7 & 1) != 0)) {
          if (-1 < i) {
            uVar4 = Wlc_ObjId(p,pWVar7);
            fprintf(__stream,"Node%d -> Node%d [style = invis];\n",(ulong)(uint)i,(ulong)uVar4);
          }
          i = Wlc_ObjId(p,pWVar7);
        }
      }
      for (iFanin = 0; iVar2 = Wlc_NtkCoNum(p), iFanin < iVar2; iFanin = iFanin + 1) {
        pWVar7 = Wlc_NtkCo(p,iFanin);
        if ((vBold == (Vec_Int_t *)0x0) || ((*(ushort *)pWVar7 >> 7 & 1) != 0)) {
          pWVar11 = Wlc_ObjCo2PoFo(p,iFanin);
          uVar4 = Wlc_ObjId(p,pWVar11);
          fprintf(__stream,"NodePo%d",(ulong)uVar4);
          fprintf(__stream," -> ");
          uVar4 = Wlc_ObjId(p,pWVar7);
          fprintf(__stream,"Node%d",(ulong)uVar4);
          fprintf(__stream," [");
          pcVar10 = "solid";
          if ((*(ushort *)pWVar7 >> 6 & 1) != 0) {
            pcVar10 = "dotted";
          }
          fprintf(__stream,"style = %s",pcVar10);
          fprintf(__stream,"]");
          fprintf(__stream,";\n");
        }
      }
      for (iFanin = 1; iVar2 = Wlc_NtkObjNumMax(p), iFanin < iVar2; iFanin = iFanin + 1) {
        pWVar7 = Wlc_NtkObj(p,iFanin);
        iVar2 = Wlc_ObjIsCi(pWVar7);
        if ((iVar2 == 0) && ((vBold == (Vec_Int_t *)0x0 || ((*(ushort *)pWVar7 >> 7 & 1) != 0)))) {
          for (local_44 = 0; iVar2 = Wlc_ObjFaninNum(pWVar7), local_44 < iVar2;
              local_44 = local_44 + 1) {
            uVar4 = Wlc_ObjFaninId(pWVar7,local_44);
            if (uVar4 != 0) {
              fprintf(__stream,"Node%d",(ulong)(uint)iFanin);
              fprintf(__stream," -> ");
              fprintf(__stream,"Node%d",(ulong)uVar4);
              fprintf(__stream," [");
              pWVar11 = Wlc_NtkObj(p,uVar4);
              pcVar10 = "solid";
              if ((*(ushort *)pWVar11 >> 6 & 1) != 0) {
                pcVar10 = "dotted";
              }
              fprintf(__stream,"style = %s",pcVar10);
              if (((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x3f) ==
                   (undefined1  [24])0x8) && (local_44 == 0)) {
                fprintf(__stream,", style = %s","bold");
              }
              fprintf(__stream,"]");
              fprintf(__stream,";\n");
            }
          }
        }
      }
      fprintf(__stream,"}");
      fprintf(__stream,"\n");
      fprintf(__stream,"\n");
      fclose(__stream);
      if (vBold != (Vec_Int_t *)0x0) {
        Wlc_NtkCleanMarks(p);
      }
    }
  }
  else {
    fprintf(_stdout,"Cannot visualize WLC with more than %d nodes.\n",2000);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////


/**Function*************************************************************

  Synopsis    [Writes the graph structure of WLC for DOT.]

  Description [Useful for graph visualization using tools such as GraphViz: 
  http://www.graphviz.org/]
  
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Wlc_NtkDumpDot( Wlc_Ntk_t * p, char * pFileName, Vec_Int_t * vBold )
{
    FILE * pFile;
    Wlc_Obj_t * pNode;
    int LevelMax, Prev, Level, i;

    if ( vBold ? (Vec_IntSize(vBold) > 2000) : (Wlc_NtkObjNum(p) > 2000) )
    {
        fprintf( stdout, "Cannot visualize WLC with more than %d nodes.\n", 2000 );
        return;
    }
    if ( (pFile = fopen( pFileName, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", pFileName );
        return;
    }

    // mark the nodes
    if ( vBold )
        Wlc_NtkForEachObjVec( vBold, p, pNode, i )
            pNode->Mark = 1;

    // compute levels
    LevelMax = 1 + Wlc_NtkCreateLevels( p );
    if ( vBold )
        LevelMax = Wlc_NtkRemapLevels( p, vBold, LevelMax );

//    Wlc_NtkForEachObj( p, pNode, i )
//        printf( "Obj=%d Lev=%d\n", i, Wlc_ObjLevel(p, pNode) );
//    printf( "\n" );

    // write the DOT header
    fprintf( pFile, "# %s\n",  "WLC structure generated by ABC" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "digraph WLC {\n" );
    fprintf( pFile, "size = \"7.5,10\";\n" );
//  fprintf( pFile, "ranksep = 0.5;\n" );
//  fprintf( pFile, "nodesep = 0.5;\n" );
    fprintf( pFile, "center = true;\n" );
//  fprintf( pFile, "orientation = landscape;\n" );
//  fprintf( pFile, "edge [fontsize = 10];\n" );
//  fprintf( pFile, "edge [dir = none];\n" );
    fprintf( pFile, "edge [dir = back];\n" );
    fprintf( pFile, "\n" );

    // labels on the left of the picture
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  node [shape = plaintext];\n" );
    fprintf( pFile, "  edge [style = invis];\n" );
    fprintf( pFile, "  LevelTitle1 [label=\"\"];\n" );
    fprintf( pFile, "  LevelTitle2 [label=\"\"];\n" );
    // generate node names with labels
    for ( Level = LevelMax; Level >= 0; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d", Level );
        fprintf( pFile, " [label = " );
        // label name
        fprintf( pFile, "\"" );
        fprintf( pFile, "\"" );
        fprintf( pFile, "];\n" );
    }

    // genetate the sequence of visible/invisible nodes to mark levels
    fprintf( pFile, "  LevelTitle1 ->  LevelTitle2 ->" );
    for ( Level = LevelMax; Level >= 0; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d",  Level );
        // the connector
        if ( Level != 0 )
            fprintf( pFile, " ->" );
        else
            fprintf( pFile, ";" );
    }
    fprintf( pFile, "\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate title box on top
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle1;\n" );
    fprintf( pFile, "  title1 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=20,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "%s", "WLC structure generated by ABC" );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "Benchmark \\\"%s\\\" from file \\\"%s\\\". ", p->pName, p->pSpec ? Extra_FileNameWithoutPath(p->pSpec) : "unknown" );
//    fprintf( pFile, "Time was %s. ",  Extra_TimeStamp() );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate statistics box
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle2;\n" );
    fprintf( pFile, "  title2 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=18,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "The word-level network contains %d nodes and spans %d levels.", Wlc_NtkObjNum(p)-Wlc_NtkCiNum(p), LevelMax-1 );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate the COs
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    // the labeling node of this level
    fprintf( pFile, "  Level%d;\n",  LevelMax );
    // generate the CO nodes
    Wlc_NtkForEachCo( p, pNode, i )
    {
        if ( vBold && !pNode->Mark )
            continue;
        pNode = Wlc_ObjCo2PoFo(p, i);
        fprintf( pFile, "  NodePo%d [label = \"%s%s %d\"", Wlc_ObjId(p, pNode), Wlc_ObjName(p, Wlc_ObjId(p, pNode)), Wlc_ObjIsPo(pNode)? "":"_in",  Wlc_ObjRange(pNode) ); 
        fprintf( pFile, ", shape = %s", i < Wlc_NtkPoNum(p) ? "invtriangle" : "box" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate nodes of each rank
    for ( Level = LevelMax - 1; Level > 0; Level-- )
    {
        fprintf( pFile, "{\n" );
        fprintf( pFile, "  rank = same;\n" );
        // the labeling node of this level
        fprintf( pFile, "  Level%d;\n",  Level );
        Wlc_NtkForEachObj( p, pNode, i )
        {
            if ( (int)Wlc_ObjLevel(p, pNode) != Level )
                continue;
            if ( vBold && !pNode->Mark )
                continue;

            if ( pNode->Type == WLC_OBJ_CONST )
            {
                //char * pName = Wlc_ObjName(p, i);
                fprintf( pFile, "  Node%d [label = \"%d:%d\'h", i, i, Wlc_ObjRange(pNode) ); 
                if ( Wlc_ObjRange(pNode) > 64 )
                {
                    Abc_TtPrintHexArrayRev( pFile, (word *)Wlc_ObjConstValue(pNode), 16 );
                    fprintf( pFile, "..." );
                }
                else
                    Abc_TtPrintHexArrayRev( pFile, (word *)Wlc_ObjConstValue(pNode), (Wlc_ObjRange(pNode) + 3) / 4 );
                fprintf( pFile, "\"" ); 
            }
            else if ( pNode->Type == WLC_OBJ_BUF || pNode->Type == WLC_OBJ_MUX )
                fprintf( pFile, "  Node%d [label = \"%d: %d\"", i, i, Wlc_ObjRange(pNode) ); 
            else if ( pNode->Type >= WLC_OBJ_LOGIC_NOT && pNode->Type <= WLC_OBJ_COMP_MOREEQU )
                fprintf( pFile, "  Node%d [label = \"%d:%s\"", i, i, Wlc_ObjTypeName(pNode) ); 
            else
                fprintf( pFile, "  Node%d [label = \"%d:%s %d\"", i, i, Wlc_ObjTypeName(pNode), Wlc_ObjRange(pNode) ); 

            if ( pNode->Type == WLC_OBJ_ARI_MULTI )
                fprintf( pFile, ", shape = doublecircle" );
            else if ( pNode->Type >= WLC_OBJ_COMP_EQU && pNode->Type <= WLC_OBJ_COMP_MOREEQU )
                fprintf( pFile, ", shape = diamond" );
            else if ( pNode->Type == WLC_OBJ_BIT_SELECT || pNode->Type == WLC_OBJ_BIT_CONCAT || pNode->Type == WLC_OBJ_FF )
                fprintf( pFile, ", shape = box" );
            else if ( pNode->Type == WLC_OBJ_BUF || pNode->Type == WLC_OBJ_BIT_ZEROPAD || pNode->Type == WLC_OBJ_BIT_SIGNEXT )
                fprintf( pFile, ", shape = triangle" );
            else if ( pNode->Type == WLC_OBJ_MUX )
                fprintf( pFile, ", shape = trapezium" );
            else
                fprintf( pFile, ", shape = ellipse" );

            if ( vBold ? pNode->Mark : ((pNode->Type >= WLC_OBJ_ARI_ADD && pNode->Type <= WLC_OBJ_ARI_SQUARE) || pNode->Type == WLC_OBJ_BIT_NOT) )
                fprintf( pFile, ", style = filled" );
            fprintf( pFile, "];\n" );
        }
        fprintf( pFile, "}" );
        fprintf( pFile, "\n" );
        fprintf( pFile, "\n" );
    }

    // generate the CI nodes
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    // the labeling node of this level
    fprintf( pFile, "  Level%d;\n",  0 );
    // generate the CI nodes
    Wlc_NtkForEachObj( p, pNode, i )
    {
        if ( !Wlc_ObjIsCi(pNode) && Wlc_ObjFaninNum(pNode) > 0 )
            continue;
        if ( vBold && !pNode->Mark )
            continue;
        if ( pNode->Type == WLC_OBJ_CONST )
        {
            //char * pName = Wlc_ObjName(p, i);
            fprintf( pFile, "  Node%d [label = \"%d:%d\'h", i, i, Wlc_ObjRange(pNode) ); 
            if ( Wlc_ObjRange(pNode) > 64 )
            {
                Abc_TtPrintHexArrayRev( pFile, (word *)Wlc_ObjConstValue(pNode), 16 );
                fprintf( pFile, "..." );
            }
            else
                Abc_TtPrintHexArrayRev( pFile, (word *)Wlc_ObjConstValue(pNode), (Wlc_ObjRange(pNode) + 3) / 4 );
            fprintf( pFile, "\"" ); 
        }
        else
        {
            fprintf( pFile, "  Node%d [label = \"%d:%s %d\"", Wlc_ObjId(p, pNode), Wlc_ObjId(p, pNode), Wlc_ObjName(p, Wlc_ObjId(p, pNode)), Wlc_ObjRange(pNode) ); 
            fprintf( pFile, ", shape = %s", (Vec_IntSize(&p->vFfs2) > 0 || Wlc_ObjCiId(pNode) < Wlc_NtkPiNum(p)) ? "triangle" : "box" );
            fprintf( pFile, ", color = coral, fillcolor = coral" );
        }
        fprintf( pFile, "];\n" );
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate invisible edges from the square down
    fprintf( pFile, "title1 -> title2 [style = invis];\n" );
    Wlc_NtkForEachCo( p, pNode, i )
    {
        if ( vBold && !pNode->Mark )
            continue;
        pNode = Wlc_ObjCo2PoFo( p, i );
        fprintf( pFile, "title2 -> NodePo%d [style = invis];\n", Wlc_ObjId(p, pNode) );
    }
    // generate invisible edges among the COs
    Prev = -1;
    Wlc_NtkForEachCo( p, pNode, i )
    {
        pNode = Wlc_ObjCo2PoFo( p, i );
        if ( vBold && !pNode->Mark )
            continue;
        if ( Prev >= 0 )
            fprintf( pFile, "NodePo%d -> NodePo%d [style = invis];\n", Prev, Wlc_ObjId(p, pNode) );
        Prev = Wlc_ObjId(p, pNode);
    }
    // generate invisible edges among the CIs
    Prev = -1;
    Wlc_NtkForEachCi( p, pNode, i )
    {
        if ( vBold && !pNode->Mark )
            continue;
        if ( Prev >= 0 )
            fprintf( pFile, "Node%d -> Node%d [style = invis];\n", Prev, Wlc_ObjId(p, pNode) );
        Prev = Wlc_ObjId(p, pNode);
    }

    // generate edges
    Wlc_NtkForEachCo( p, pNode, i )
    {
        if ( vBold && !pNode->Mark )
            continue;
        fprintf( pFile, "NodePo%d",  Wlc_ObjId(p, Wlc_ObjCo2PoFo(p, i)) );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Wlc_ObjId(p, pNode) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", pNode->Signed? "dotted" : "solid" );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );
    }
    Wlc_NtkForEachObj( p, pNode, i )
    {
        int k, iFanin;
        if ( Wlc_ObjIsCi(pNode) )
            continue;
        if ( vBold && !pNode->Mark )
            continue;
        // generate the edge from this node to the next
        Wlc_ObjForEachFanin( pNode, iFanin, k ) if ( iFanin )
        {
            fprintf( pFile, "Node%d",  i );
            fprintf( pFile, " -> " );
            fprintf( pFile, "Node%d",  iFanin );
            fprintf( pFile, " [" );
            fprintf( pFile, "style = %s", Wlc_NtkObj(p, iFanin)->Signed? "dotted" : "solid" );
            if ( pNode->Type == WLC_OBJ_MUX && k == 0 )
                fprintf( pFile, ", style = %s", "bold" );
            fprintf( pFile, "]" );
            fprintf( pFile, ";\n" );
        }
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );
    fclose( pFile );

    // unmark nodes
    if ( vBold )
        Wlc_NtkCleanMarks( p );
}